

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityMessages::testOutput
          (TeamcityMessages *this,string *name,string *output,string *flowId,bool isStdError)

{
  char *local_b8;
  string local_a8;
  string local_88;
  string local_58;
  RaiiMessage local_38;
  RaiiMessage msg;
  bool isStdError_local;
  string *flowId_local;
  string *output_local;
  string *name_local;
  TeamcityMessages *this_local;
  
  if (isStdError) {
    local_b8 = "testStdErr";
  }
  else {
    local_b8 = "testStdOut";
  }
  msg.m_out._7_1_ = isStdError;
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_38,local_b8,this->m_out);
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_38,"name",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_88,(string *)output);
  anon_unknown_1::RaiiMessage::writeProperty(&local_38,"out",&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_38,"flowId",&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_38);
  return;
}

Assistant:

void TeamcityMessages::testOutput(const std::string& name, const std::string& output, const std::string& flowId, const bool isStdError)
{
    RaiiMessage msg(isStdError ? "testStdErr" : "testStdOut", *m_out);
    msg.writeProperty("name", name);
    msg.writeProperty("out", output);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}